

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Vec_Wec_t * Gia_ManCreateCoSupps(Gia_Man_t *p,int fVerbose)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  uint uVar4;
  undefined8 uVar5;
  void *__ptr;
  int iVar6;
  int iVar7;
  uint uVar8;
  Vec_Wec_t *pVVar9;
  Vec_Int_t *pVVar10;
  int *__ptr_00;
  void *pvVar11;
  int *__ptr_01;
  int *piVar12;
  long lVar13;
  int *piVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  int *piVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  timespec ts;
  long local_58;
  timespec local_40;
  
  iVar6 = clock_gettime(3,&local_40);
  if (iVar6 < 0) {
    local_58 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    local_58 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  iVar6 = p->vCos->nSize;
  pVVar9 = (Vec_Wec_t *)malloc(0x10);
  iVar7 = iVar6;
  if (iVar6 - 1U < 7) {
    iVar7 = 8;
  }
  pVVar9->nCap = iVar7;
  if (iVar7 == 0) {
    pVVar10 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar10 = (Vec_Int_t *)calloc((long)iVar7,0x10);
  }
  pVVar9->pArray = pVVar10;
  pVVar9->nSize = iVar6;
  iVar6 = p->nObjs;
  __ptr_00 = (int *)malloc(0x10);
  iVar7 = 8;
  if (6 < iVar6 - 1U) {
    iVar7 = iVar6;
  }
  *__ptr_00 = iVar7;
  if (iVar7 == 0) {
    pvVar11 = (void *)0x0;
  }
  else {
    pvVar11 = calloc((long)iVar7,0x10);
  }
  *(void **)(__ptr_00 + 2) = pvVar11;
  __ptr_00[1] = iVar6;
  pVVar10 = p->vCis;
  iVar7 = iVar6;
  if (0 < pVVar10->nSize) {
    lVar13 = 0;
    do {
      iVar19 = pVVar10->pArray[lVar13];
      if (((long)iVar19 < 0) || (iVar7 = p->nObjs, iVar7 <= iVar19)) goto LAB_00688f0e;
      if (iVar19 == 0) goto LAB_00688b7f;
      if (iVar6 <= iVar19) goto LAB_00688eef;
      Vec_IntPush((Vec_Int_t *)((long)iVar19 * 0x10 + (long)pvVar11),(int)lVar13);
      lVar13 = lVar13 + 1;
      pVVar10 = p->vCis;
    } while (lVar13 < pVVar10->nSize);
    iVar7 = p->nObjs;
  }
  if (0 < iVar7) {
LAB_00688b7f:
    uVar20 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar5 = *(undefined8 *)(p->pObjs + uVar20);
      uVar8 = (uint)uVar5;
      if ((~uVar8 & 0x1fffffff) != 0 && -1 < (int)uVar8) {
        uVar8 = (int)uVar20 - (uVar8 & 0x1fffffff);
        if ((int)uVar8 < 0) goto LAB_00688eef;
        uVar4 = __ptr_00[1];
        if (((((int)uVar4 <= (int)uVar8) ||
             (uVar16 = (int)uVar20 - ((uint)((ulong)uVar5 >> 0x20) & 0x1fffffff), (int)uVar16 < 0))
            || (uVar4 <= uVar16)) || (uVar4 <= uVar20)) goto LAB_00688eef;
        lVar13 = *(long *)(__ptr_00 + 2);
        lVar15 = (ulong)uVar8 * 0x10 + lVar13;
        lVar21 = (ulong)uVar16 * 0x10 + lVar13;
        lVar17 = uVar20 * 0x10;
        piVar1 = (int *)(lVar13 + lVar17);
        iVar7 = *(int *)(lVar15 + 4);
        iVar19 = *(int *)(lVar21 + 4);
        iVar6 = iVar19 + iVar7;
        __ptr_01 = *(int **)(lVar13 + 8 + lVar17);
        if (*(int *)(lVar13 + lVar17) < iVar6) {
          if (__ptr_01 == (int *)0x0) {
            __ptr_01 = (int *)malloc((long)iVar6 << 2);
          }
          else {
            __ptr_01 = (int *)realloc(__ptr_01,(long)iVar6 << 2);
          }
          *(int **)(piVar1 + 2) = __ptr_01;
          if (__ptr_01 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          *piVar1 = iVar6;
          iVar7 = *(int *)(lVar15 + 4);
          iVar19 = *(int *)(lVar21 + 4);
        }
        piVar18 = *(int **)(lVar15 + 8);
        piVar14 = *(int **)(lVar21 + 8);
        piVar2 = piVar18 + iVar7;
        piVar3 = piVar14 + iVar19;
        piVar12 = __ptr_01;
        if ((0 < iVar7) && (0 < iVar19)) {
          do {
            iVar6 = *piVar18;
            iVar7 = *piVar14;
            if (iVar6 == iVar7) {
              piVar18 = piVar18 + 1;
              *piVar12 = iVar6;
              piVar14 = piVar14 + 1;
            }
            else if (iVar6 < iVar7) {
              piVar18 = piVar18 + 1;
              *piVar12 = iVar6;
            }
            else {
              piVar14 = piVar14 + 1;
              *piVar12 = iVar7;
            }
            piVar12 = piVar12 + 1;
          } while ((piVar18 < piVar2) && (piVar14 < piVar3));
        }
        for (; piVar18 < piVar2; piVar18 = piVar18 + 1) {
          *piVar12 = *piVar18;
          piVar12 = piVar12 + 1;
        }
        for (; piVar14 < piVar3; piVar14 = piVar14 + 1) {
          *piVar12 = *piVar14;
          piVar12 = piVar12 + 1;
        }
        iVar6 = (int)((ulong)((long)piVar12 - (long)__ptr_01) >> 2);
        piVar1[1] = iVar6;
        if (*piVar1 < iVar6) {
          __assert_fail("vArr->nSize <= vArr->nCap",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x6ec,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        if (iVar6 < *(int *)(lVar15 + 4)) {
          __assert_fail("vArr->nSize >= vArr1->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x6ed,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        if (iVar6 < *(int *)(lVar21 + 4)) {
          __assert_fail("vArr->nSize >= vArr2->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x6ee,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        iVar7 = p->nObjs;
      }
      uVar20 = uVar20 + 1;
    } while ((long)uVar20 < (long)iVar7);
  }
  pVVar10 = p->vCos;
  if (0 < pVVar10->nSize) {
    lVar13 = 0;
    do {
      iVar6 = pVVar10->pArray[lVar13];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
LAB_00688f0e:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (((pVVar9->nSize <= lVar13) ||
          (uVar8 = iVar6 - (*(uint *)(p->pObjs + iVar6) & 0x1fffffff), (int)uVar8 < 0)) ||
         (__ptr_00[1] <= (int)uVar8)) {
LAB_00688eef:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      if (0 < *(int *)(*(long *)(__ptr_00 + 2) + 4 + (ulong)uVar8 * 0x10)) {
        pVVar10 = pVVar9->pArray;
        lVar17 = *(long *)(__ptr_00 + 2) + (ulong)uVar8 * 0x10;
        lVar15 = 0;
        do {
          Vec_IntPush(pVVar10 + lVar13,*(int *)(*(long *)(lVar17 + 8) + lVar15 * 4));
          lVar15 = lVar15 + 1;
        } while (lVar15 < *(int *)(lVar17 + 4));
        pVVar10 = p->vCos;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar10->nSize);
  }
  iVar6 = *__ptr_00;
  pvVar11 = *(void **)(__ptr_00 + 2);
  if ((long)iVar6 < 1) {
    if (pvVar11 == (void *)0x0) goto LAB_00688e3e;
  }
  else {
    lVar13 = 0;
    do {
      __ptr = *(void **)((long)pvVar11 + lVar13 + 8);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)pvVar11 + lVar13 + 8) = 0;
      }
      lVar13 = lVar13 + 0x10;
    } while ((long)iVar6 * 0x10 != lVar13);
  }
  free(pvVar11);
LAB_00688e3e:
  free(__ptr_00);
  if (fVerbose != 0) {
    iVar6 = clock_gettime(3,&local_40);
    if (iVar6 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    Abc_Print(1,"%s =","Support computation");
    Abc_Print(1,"%9.2f sec\n",(double)(lVar13 + local_58) / 1000000.0);
  }
  return pVVar9;
}

Assistant:

Vec_Wec_t * Gia_ManCreateCoSupps( Gia_Man_t * p, int fVerbose )
{
    abctime clk = Abc_Clock();
    Gia_Obj_t * pObj; int i, Id;
    Vec_Wec_t * vSuppsCo = Vec_WecStart( Gia_ManCoNum(p) );
    Vec_Wec_t * vSupps = Vec_WecStart( Gia_ManObjNum(p) );
    Gia_ManForEachCiId( p, Id, i )
        Vec_IntPush( Vec_WecEntry(vSupps, Id), i );
    Gia_ManForEachAnd( p, pObj, Id )
        Vec_IntTwoMerge2( Vec_WecEntry(vSupps, Gia_ObjFaninId0(pObj, Id)), 
                          Vec_WecEntry(vSupps, Gia_ObjFaninId1(pObj, Id)), 
                          Vec_WecEntry(vSupps, Id) ); 
    Gia_ManForEachCo( p, pObj, i )
        Vec_IntAppend( Vec_WecEntry(vSuppsCo, i), Vec_WecEntry(vSupps, Gia_ObjFaninId0p(p, pObj)) );
    Vec_WecFree( vSupps );
    if ( fVerbose )
        Abc_PrintTime( 1, "Support computation", Abc_Clock() - clk );
    return vSuppsCo;
}